

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_z3_8x4_avx2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *left,int upsample_left,int dy,int bd)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ushort uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  uint uVar60;
  int iVar61;
  undefined1 (*pauVar62) [16];
  undefined1 (*pauVar63) [16];
  long lVar64;
  longlong *plVar65;
  uint in_ECX;
  long in_RDX;
  long in_RSI;
  longlong *in_RDI;
  uint in_R8D;
  int in_R9D;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [16];
  __m128i d [4];
  __m128i dstvec [8];
  int i;
  int base;
  __m128i res1;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int x;
  __m128i a1_128;
  __m128i a0_128;
  __m128i mask128;
  __m128i base_inc128;
  __m128i max_base_x128;
  __m128i a_mbase_x;
  __m256i c3f;
  __m256i diff;
  __m256i a16;
  __m256i a32;
  __m256i a1;
  __m256i a0;
  int max_base_x;
  int frac_bits;
  int i_1;
  int base_1;
  __m128i res1_1;
  __m256i shift_1;
  __m256i res_1;
  __m256i b_1;
  int r_1;
  int x_1;
  __m128i mask128_1;
  __m128i base_inc128_1;
  __m128i max_base_x128_1;
  __m128i a_mbase_x_1;
  __m256i diff_1;
  __m256i a16_1;
  __m256i a32_1;
  __m256i a1_1;
  __m256i a0_1;
  int max_base_x_1;
  int frac_bits_1;
  longlong local_1120;
  longlong lStack_1118;
  longlong local_1110;
  longlong lStack_1108;
  longlong local_1100;
  longlong lStack_10f8;
  longlong local_10f0;
  longlong lStack_10e8;
  longlong local_10e0 [4];
  longlong alStack_10c0 [2];
  longlong alStack_10b0 [2];
  longlong alStack_10a0 [2];
  longlong alStack_1090 [2];
  longlong alStack_1080 [2];
  longlong alStack_1070 [5];
  long local_1048;
  longlong *local_1040;
  int local_1038;
  int local_1034;
  undefined8 local_1030;
  undefined8 uStack_1028;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  int local_fa8;
  uint local_fa4;
  undefined1 local_fa0 [16];
  undefined1 local_f90 [16];
  undefined1 local_f80 [16];
  undefined8 local_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  longlong local_f50;
  longlong lStack_f48;
  undefined1 local_f40 [16];
  undefined1 auStack_f30 [16];
  undefined1 local_f20 [32];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined1 local_ee0 [32];
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined1 auStack_eb0 [16];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined1 auStack_e90 [16];
  uint local_e68;
  int local_e64;
  byte local_e5c;
  longlong *local_e50;
  undefined4 local_e44;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  ushort local_daa;
  undefined2 local_da8;
  ushort local_da6;
  undefined2 local_da4;
  undefined2 local_da2;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  ushort local_d44;
  ushort local_d42;
  uint8_t local_d40 [8];
  uint8_t auStack_d38 [8];
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [16];
  undefined1 auStack_d10 [16];
  undefined2 local_d00;
  undefined2 local_cfe;
  undefined2 local_cfc;
  undefined2 local_cfa;
  undefined2 local_cf8;
  undefined2 local_cf6;
  undefined2 local_cf4;
  undefined2 local_cf2;
  undefined2 local_cf0;
  undefined2 local_cee;
  undefined2 local_cec;
  undefined2 local_cea;
  undefined2 local_ce8;
  undefined2 local_ce6;
  undefined2 local_ce4;
  undefined2 local_ce2;
  undefined1 local_ce0 [32];
  undefined2 local_cc0;
  undefined2 local_cbe;
  undefined2 local_cbc;
  undefined2 local_cba;
  undefined2 local_cb8;
  undefined2 local_cb6;
  undefined2 local_cb4;
  undefined2 local_cb2;
  undefined2 local_cb0;
  undefined2 local_cae;
  undefined2 local_cac;
  undefined2 local_caa;
  undefined2 local_ca8;
  undefined2 local_ca6;
  undefined2 local_ca4;
  undefined2 local_ca2;
  undefined1 local_ca0 [16];
  undefined1 auStack_c90 [16];
  ushort local_c80;
  ushort local_c7e;
  ushort local_c7c;
  ushort local_c7a;
  ushort local_c78;
  ushort local_c76;
  ushort local_c74;
  ushort local_c72;
  ushort local_c70;
  ushort local_c6e;
  ushort local_c6c;
  ushort local_c6a;
  ushort local_c68;
  ushort local_c66;
  ushort local_c64;
  ushort local_c62;
  undefined1 local_c60 [32];
  undefined2 local_c40;
  undefined2 local_c3e;
  undefined2 local_c3c;
  undefined2 local_c3a;
  undefined2 local_c38;
  undefined2 local_c36;
  undefined2 local_c34;
  undefined2 local_c32;
  undefined2 local_c30;
  undefined2 local_c2e;
  undefined2 local_c2c;
  undefined2 local_c2a;
  undefined2 local_c28;
  undefined2 local_c26;
  undefined2 local_c24;
  undefined2 local_c22;
  undefined1 local_c20 [32];
  ushort local_c00;
  ushort local_bfe;
  ushort local_bfc;
  ushort local_bfa;
  ushort local_bf8;
  ushort local_bf6;
  ushort local_bf4;
  ushort local_bf2;
  ushort local_bf0;
  ushort local_bee;
  ushort local_bec;
  ushort local_bea;
  ushort local_be8;
  ushort local_be6;
  ushort local_be4;
  ushort local_be2;
  undefined1 local_be0 [16];
  ushort local_bd0;
  ushort local_bce;
  ushort local_bcc;
  ushort local_bca;
  ushort local_bc8;
  ushort local_bc6;
  ushort local_bc4;
  ushort local_bc2;
  undefined1 local_bc0 [16];
  ushort local_bb0;
  ushort local_bae;
  ushort local_bac;
  ushort local_baa;
  ushort local_ba8;
  ushort local_ba6;
  ushort local_ba4;
  ushort local_ba2;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined1 local_b20 [16];
  undefined1 auStack_b10 [16];
  undefined1 local_b00 [32];
  int local_ad8;
  uint local_ad4;
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  int local_a48;
  uint local_a44;
  undefined1 local_a40 [16];
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  longlong local_a10;
  longlong lStack_a08;
  undefined1 local_a00 [32];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [24];
  undefined8 uStack_988;
  undefined1 local_980 [32];
  uint local_948;
  int local_944;
  longlong *local_930;
  undefined4 local_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined1 local_8e0 [16];
  ushort local_8d0;
  ushort local_8ce;
  ushort local_8cc;
  ushort local_8ca;
  ushort local_8c8;
  ushort local_8c6;
  ushort local_8c4;
  ushort local_8c2;
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [16];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 auStack_870 [16];
  undefined1 local_860 [32];
  undefined1 (*local_830) [16];
  undefined1 (*local_828) [16];
  undefined1 (*local_820) [16];
  undefined1 (*local_818) [16];
  ushort local_810;
  ushort local_80e;
  ushort local_80c;
  ushort local_80a;
  ushort local_808;
  ushort local_806;
  ushort local_804;
  ushort local_802;
  undefined1 local_800 [16];
  ushort local_7f0;
  ushort local_7ee;
  ushort local_7ec;
  ushort local_7ea;
  ushort local_7e8;
  ushort local_7e6;
  ushort local_7e4;
  ushort local_7e2;
  ushort local_7e0;
  ushort local_7de;
  ushort local_7dc;
  ushort local_7da;
  ushort local_7d8;
  ushort local_7d6;
  ushort local_7d4;
  ushort local_7d2;
  undefined1 local_7d0 [16];
  ushort local_7b4;
  ushort local_7b2;
  ushort local_7b0;
  ushort local_7ae;
  ushort local_7ac;
  ushort local_7aa;
  ushort local_7a8;
  ushort local_7a6;
  undefined4 local_7a4;
  undefined1 local_7a0 [32];
  undefined4 local_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined4 local_724;
  undefined1 local_720 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  longlong local_600;
  longlong lStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  longlong local_5d0;
  longlong lStack_5c8;
  undefined4 local_5b8;
  uint local_5b4;
  undefined4 local_5b0;
  uint local_5ac;
  undefined4 local_5a8;
  uint local_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [16];
  undefined1 auStack_530 [16];
  undefined4 local_520;
  undefined4 local_51c;
  undefined4 local_518;
  undefined4 local_514;
  undefined4 local_510;
  undefined4 local_50c;
  undefined4 local_508;
  undefined4 local_504;
  undefined1 local_500 [16];
  undefined1 auStack_4f0 [16];
  uint local_4e0;
  uint local_4dc;
  uint local_4d8;
  uint local_4d4;
  uint local_4d0;
  uint local_4cc;
  uint local_4c8;
  uint local_4c4;
  undefined1 local_4c0 [32];
  undefined4 local_4a0;
  undefined4 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  undefined4 local_490;
  undefined4 local_48c;
  undefined4 local_488;
  undefined4 local_484;
  undefined1 local_480 [16];
  undefined1 auStack_470 [16];
  uint local_460;
  uint local_45c;
  uint local_458;
  uint local_454;
  uint local_450;
  uint local_44c;
  uint local_448;
  uint local_444;
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 local_41c;
  undefined4 local_418;
  undefined4 local_414;
  undefined4 local_410;
  undefined4 local_40c;
  undefined4 local_408;
  undefined4 local_404;
  undefined1 local_400 [16];
  undefined1 auStack_3f0 [16];
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined4 local_3bc;
  undefined4 local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  undefined4 local_3ac;
  undefined4 local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  uint local_398;
  int local_394;
  int local_390;
  int local_38c;
  uint local_388;
  undefined4 local_384;
  undefined1 local_380 [32];
  undefined4 local_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined4 local_304;
  undefined1 local_300 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined4 local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined1 local_100 [16];
  uint local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [16];
  uint local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  undefined1 local_c0 [16];
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  
  auVar58._8_8_ = auStack_b50._8_8_;
  auVar58._0_8_ = auStack_b50._0_8_;
  auVar57._8_8_ = local_b60._8_8_;
  auVar57._0_8_ = local_b60._0_8_;
  auVar69._24_8_ = auStack_870._8_8_;
  auVar69._16_8_ = auStack_870._0_8_;
  auVar69._8_8_ = local_880._8_8_;
  auVar69._0_8_ = local_880._0_8_;
  auVar70._24_8_ = auStack_8b0._8_8_;
  auVar70._16_8_ = auStack_8b0._0_8_;
  auVar70._8_8_ = local_8c0._8_8_;
  auVar70._0_8_ = local_8c0._0_8_;
  auVar67._24_8_ = auStack_b10._8_8_;
  auVar67._16_8_ = auStack_b10._0_8_;
  auVar67._8_8_ = local_b20._8_8_;
  auVar67._0_8_ = local_b20._0_8_;
  auVar68._24_8_ = auStack_b30._8_8_;
  auVar68._16_8_ = auStack_b30._0_8_;
  auVar68._8_8_ = local_b40._8_8_;
  auVar68._0_8_ = local_b40._0_8_;
  auVar66._24_8_ = auStack_f30._8_8_;
  auVar66._16_8_ = auStack_f30._0_8_;
  auVar66._8_8_ = local_f40._8_8_;
  auVar66._0_8_ = local_f40._0_8_;
  local_e5c = (byte)in_ECX;
  if (in_R9D < 0xc) {
    local_e44 = 8;
    iVar59 = 6 - in_ECX;
    uVar60 = 0xb << (local_e5c & 0x1f);
    local_da2 = 0x10;
    local_ce2 = 0x10;
    local_ce4 = 0x10;
    local_ce6 = 0x10;
    local_ce8 = 0x10;
    local_cea = 0x10;
    local_cec = 0x10;
    local_cee = 0x10;
    local_cf0 = 0x10;
    local_cf2 = 0x10;
    local_cf4 = 0x10;
    local_cf6 = 0x10;
    local_cf8 = 0x10;
    local_cfa = 0x10;
    local_cfc = 0x10;
    local_cfe = 0x10;
    local_d00 = 0x10;
    auVar66._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,6);
    auVar4 = vpinsrw_avx(auVar66._0_16_,0x10,7);
    auVar66._0_16_ = vpinsrw_avx(ZEXT216(0x10),0x10,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x10,6);
    auVar5 = vpinsrw_avx(auVar66._0_16_,0x10,7);
    local_d20._0_8_ = auVar4._0_8_;
    local_d20._8_8_ = auVar4._8_8_;
    auStack_d10._0_8_ = auVar5._0_8_;
    auStack_d10._8_8_ = auVar5._8_8_;
    local_f00 = local_d20._0_8_;
    uStack_ef8 = local_d20._8_8_;
    uStack_ef0 = auStack_d10._0_8_;
    uStack_ee8 = auStack_d10._8_8_;
    uVar1 = *(ushort *)(in_RDX + (long)(int)uVar60 * 2);
    auVar66._0_16_ = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,6);
    auVar6 = vpinsrw_avx(auVar66._0_16_,(uint)uVar1,7);
    local_be0._0_8_ = auVar6._0_8_;
    local_be0._8_8_ = auVar6._8_8_;
    local_f50 = local_be0._0_8_;
    lStack_f48 = local_be0._8_8_;
    local_e68._0_2_ = (ushort)uVar60;
    local_d44 = (ushort)local_e68;
    local_ba2 = (ushort)local_e68;
    local_ba4 = (ushort)local_e68;
    local_ba6 = (ushort)local_e68;
    local_ba8 = (ushort)local_e68;
    local_baa = (ushort)local_e68;
    local_bac = (ushort)local_e68;
    local_bae = (ushort)local_e68;
    local_bb0 = (ushort)local_e68;
    auVar66._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_e68),uVar60 & 0xffff,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,6);
    auVar7 = vpinsrw_avx(auVar66._0_16_,uVar60 & 0xffff,7);
    local_bc0._0_8_ = auVar7._0_8_;
    local_bc0._8_8_ = auVar7._8_8_;
    local_f60 = local_bc0._0_8_;
    uStack_f58 = local_bc0._8_8_;
    local_da4 = 0x3f;
    local_ca2 = 0x3f;
    local_ca4 = 0x3f;
    local_ca6 = 0x3f;
    local_ca8 = 0x3f;
    local_caa = 0x3f;
    local_cac = 0x3f;
    local_cae = 0x3f;
    local_cb0 = 0x3f;
    local_cb2 = 0x3f;
    local_cb4 = 0x3f;
    local_cb6 = 0x3f;
    local_cb8 = 0x3f;
    local_cba = 0x3f;
    local_cbc = 0x3f;
    local_cbe = 0x3f;
    local_cc0 = 0x3f;
    auVar66._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,6);
    auVar66._16_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,7);
    auVar66._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,2);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,3);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,4);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,5);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,6);
    auVar66._0_16_ = vpinsrw_avx(auVar66._0_16_,0x3f,7);
    auVar66._0_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar66._0_16_;
    auVar66._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar66._16_16_;
    local_ce0._16_8_ = auVar66._16_8_;
    local_ce0._24_8_ = auVar66._24_8_;
    local_fa4 = in_R8D;
    for (local_fa8 = 0; local_e68 = uVar60, local_e64 = iVar59, local_e50 = local_10e0,
        local_d42 = uVar1, auVar10 = auVar66, local_bd0 = uVar1, local_bce = uVar1,
        local_bcc = uVar1, local_bca = uVar1, local_bc8 = uVar1, local_bc6 = uVar1,
        local_bc4 = uVar1, local_bc2 = uVar1, auVar71 = local_8e0, auVar2 = local_540,
        auVar3 = auStack_530, local_fa8 < 8; local_fa8 = local_fa8 + 1) {
      iVar61 = (int)local_fa4 >> ((byte)iVar59 & 0x1f);
      local_1034 = iVar61;
      if ((int)uVar60 <= iVar61) {
        for (local_1038 = local_fa8; local_1038 < 8; local_1038 = local_1038 + 1) {
          local_10e0[(long)local_1038 * 2] = local_be0._0_8_;
          local_10e0[(long)local_1038 * 2 + 1] = local_be0._8_8_;
        }
        break;
      }
      pauVar62 = (undefined1 (*) [16])(in_RDX + (long)iVar61 * 2);
      local_f90 = *pauVar62;
      pauVar63 = (undefined1 (*) [16])(in_RDX + (long)iVar61 * 2 + 2);
      local_fa0 = *pauVar63;
      uVar12 = (ushort)iVar61;
      if (in_ECX == 0) {
        local_7d4 = uVar12 + 1;
        local_7d6 = uVar12 + 2;
        local_7d8 = uVar12 + 3;
        local_7da = uVar12 + 4;
        local_7dc = uVar12 + 5;
        local_7de = uVar12 + 6;
        local_7e0 = uVar12 + 7;
        auVar68._0_16_ = vpinsrw_avx(ZEXT216(uVar12),(uint)local_7d4,1);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,(uint)local_7d6,2);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,(uint)local_7d8,3);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,(uint)local_7da,4);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,(uint)local_7dc,5);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,(uint)local_7de,6);
        local_7d0 = vpinsrw_avx(auVar68._0_16_,(uint)local_7e0,7);
        local_f70 = local_7d0._0_8_;
        uStack_f68 = local_7d0._8_8_;
        local_daa = (ushort)local_fa4;
        local_be2 = (ushort)local_fa4;
        local_be4 = (ushort)local_fa4;
        local_be6 = (ushort)local_fa4;
        local_be8 = (ushort)local_fa4;
        local_bea = (ushort)local_fa4;
        local_bec = (ushort)local_fa4;
        local_bee = (ushort)local_fa4;
        local_bf0 = (ushort)local_fa4;
        local_bf2 = (ushort)local_fa4;
        local_bf4 = (ushort)local_fa4;
        local_bf6 = (ushort)local_fa4;
        local_bf8 = (ushort)local_fa4;
        local_bfa = (ushort)local_fa4;
        local_bfc = (ushort)local_fa4;
        local_bfe = (ushort)local_fa4;
        local_c00 = (ushort)local_fa4;
        auVar68._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fa4),local_fa4 & 0xffff,1);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,2);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,3);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,4);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,5);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,6);
        auVar68._16_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,7);
        auVar68._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fa4),local_fa4 & 0xffff,1);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,2);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,3);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,4);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,5);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,6);
        auVar68._0_16_ = vpinsrw_avx(auVar68._0_16_,local_fa4 & 0xffff,7);
        auVar68._0_16_ = ZEXT116(0) * auVar68._16_16_ + ZEXT116(1) * auVar68._0_16_;
        auVar68._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar68._16_16_;
        local_c20._16_8_ = auVar68._16_8_;
        local_c20._24_8_ = auVar68._24_8_;
        auVar51._16_8_ = local_c20._16_8_;
        auVar51._0_16_ = auVar68._0_16_;
        auVar51._24_8_ = local_c20._24_8_;
        auVar50._16_8_ = local_ce0._16_8_;
        auVar50._0_16_ = auVar66._0_16_;
        auVar50._24_8_ = local_ce0._24_8_;
        local_720 = vpand_avx2(auVar51,auVar50);
        local_724 = 1;
        local_1020 = vpsrlw_avx2(local_720,ZEXT416(1));
        local_c20 = auVar68;
        local_7d2 = uVar12;
        local_7b4 = uVar12;
        local_7b2 = local_7d4;
        local_7b0 = local_7d6;
        local_7ae = local_7d8;
        local_7ac = local_7da;
        local_7aa = local_7dc;
        local_7a8 = local_7de;
        local_7a6 = local_7e0;
        auVar57 = auVar66._0_16_;
        auVar58 = auVar66._16_16_;
      }
      else {
        local_d40 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._0_8_;
        auStack_d38 = (uint8_t  [8])HighbdEvenOddMaskx4[0]._8_8_;
        auVar2._8_8_ = HighbdEvenOddMaskx4[0]._8_8_;
        auVar2._0_8_ = HighbdEvenOddMaskx4[0]._0_8_;
        local_f90 = vpshufb_avx(*pauVar62,auVar2);
        local_fa0 = vpsrldq_avx(local_f90,8);
        local_804 = uVar12 + 2;
        local_806 = uVar12 + 4;
        local_808 = uVar12 + 6;
        local_80a = uVar12 + 8;
        local_80c = uVar12 + 10;
        local_80e = uVar12 + 0xc;
        local_810 = uVar12 + 0xe;
        auVar67._0_16_ = vpinsrw_avx(ZEXT216(uVar12),(uint)local_804,1);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,(uint)local_806,2);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,(uint)local_808,3);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,(uint)local_80a,4);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,(uint)local_80c,5);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,(uint)local_80e,6);
        local_800 = vpinsrw_avx(auVar67._0_16_,(uint)local_810,7);
        local_f70 = local_800._0_8_;
        uStack_f68 = local_800._8_8_;
        local_da6 = (ushort)local_fa4;
        local_c62 = (ushort)local_fa4;
        local_c64 = (ushort)local_fa4;
        local_c66 = (ushort)local_fa4;
        local_c68 = (ushort)local_fa4;
        local_c6a = (ushort)local_fa4;
        local_c6c = (ushort)local_fa4;
        local_c6e = (ushort)local_fa4;
        local_c70 = (ushort)local_fa4;
        local_c72 = (ushort)local_fa4;
        local_c74 = (ushort)local_fa4;
        local_c76 = (ushort)local_fa4;
        local_c78 = (ushort)local_fa4;
        local_c7a = (ushort)local_fa4;
        local_c7c = (ushort)local_fa4;
        local_c7e = (ushort)local_fa4;
        local_c80 = (ushort)local_fa4;
        auVar67._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fa4),local_fa4 & 0xffff,1);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,2);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,3);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,4);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,5);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,6);
        local_ca0 = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,7);
        auVar67._0_16_ = vpinsrw_avx(ZEXT216((ushort)local_fa4),local_fa4 & 0xffff,1);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,2);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,3);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,4);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,5);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,6);
        auStack_c90 = vpinsrw_avx(auVar67._0_16_,local_fa4 & 0xffff,7);
        local_6e0 = local_ca0._0_8_;
        uStack_6d8 = local_ca0._8_8_;
        uStack_6d0 = auStack_c90._0_8_;
        uStack_6c8 = auStack_c90._8_8_;
        auVar53._16_8_ = auStack_c90._0_8_;
        auVar53._0_16_ = local_ca0;
        auVar53._24_8_ = auStack_c90._8_8_;
        local_b00 = vpsllw_avx2(auVar53,ZEXT416(in_ECX));
        local_da8 = 0x3f;
        local_c22 = 0x3f;
        local_c24 = 0x3f;
        local_c26 = 0x3f;
        local_c28 = 0x3f;
        local_c2a = 0x3f;
        local_c2c = 0x3f;
        local_c2e = 0x3f;
        local_c30 = 0x3f;
        local_c32 = 0x3f;
        local_c34 = 0x3f;
        local_c36 = 0x3f;
        local_c38 = 0x3f;
        local_c3a = 0x3f;
        local_c3c = 0x3f;
        local_c3e = 0x3f;
        local_c40 = 0x3f;
        auVar67._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,2);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,3);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,4);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,5);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,6);
        auVar67._16_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,7);
        auVar67._0_16_ = vpinsrw_avx(ZEXT216(0x3f),0x3f,1);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,2);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,3);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,4);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,5);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,6);
        auVar67._0_16_ = vpinsrw_avx(auVar67._0_16_,0x3f,7);
        auVar67._0_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar67._0_16_;
        auVar67._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar67._16_16_;
        local_c60._16_8_ = auVar67._16_8_;
        local_c60._24_8_ = auVar67._24_8_;
        auVar52._16_8_ = local_c60._16_8_;
        auVar52._0_16_ = auVar67._0_16_;
        auVar52._24_8_ = local_c60._24_8_;
        local_7a0 = vpand_avx2(local_b00,auVar52);
        local_7a4 = 1;
        local_1020 = vpsrlw_avx2(local_7a0,ZEXT416(1));
        local_d30 = *(undefined8 *)*pauVar62;
        uStack_d28 = *(undefined8 *)(*pauVar62 + 8);
        local_c60 = auVar67;
        local_802 = uVar12;
        local_7f0 = uVar12;
        local_7ee = local_804;
        local_7ec = local_806;
        local_7ea = local_808;
        local_7e8 = local_80a;
        local_7e6 = local_80c;
        local_7e4 = local_80e;
        local_7e2 = local_810;
      }
      auVar71 = ZEXT416(1);
      auStack_eb0._0_8_ = auVar71._0_8_;
      uVar17 = auStack_eb0._0_8_;
      auVar49._16_8_ = auStack_eb0._0_8_;
      auVar49._0_16_ = local_fa0;
      auVar49._24_8_ = 0;
      auVar48._16_8_ = auStack_eb0._0_8_;
      auVar48._0_16_ = local_f90;
      auVar48._24_8_ = 0;
      auVar11 = vpsubw_avx2(auVar49,auVar48);
      local_6a4 = 5;
      auVar54._16_8_ = auStack_eb0._0_8_;
      auVar54._0_16_ = local_f90;
      auVar54._24_8_ = 0;
      auVar10 = vpsllw_avx2(auVar54,ZEXT416(5));
      local_ee0._0_8_ = auVar10._0_8_;
      uVar18 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar10._8_8_;
      uVar19 = local_ee0._8_8_;
      local_ee0._16_8_ = auVar10._16_8_;
      uVar20 = local_ee0._16_8_;
      local_ee0._24_8_ = auVar10._24_8_;
      uVar21 = local_ee0._24_8_;
      auVar47._16_8_ = auStack_d10._0_8_;
      auVar47._0_16_ = auVar4;
      auVar47._24_8_ = auStack_d10._8_8_;
      auVar10 = vpaddw_avx2(auVar10,auVar47);
      local_f20._0_8_ = auVar11._0_8_;
      uVar22 = local_f20._0_8_;
      local_f20._8_8_ = auVar11._8_8_;
      uVar23 = local_f20._8_8_;
      local_f20._16_8_ = auVar11._16_8_;
      uVar24 = local_f20._16_8_;
      local_f20._24_8_ = auVar11._24_8_;
      uVar25 = local_f20._24_8_;
      auVar9 = vpmullw_avx2(auVar11,local_1020);
      local_ee0._0_8_ = auVar10._0_8_;
      uVar26 = local_ee0._0_8_;
      local_ee0._8_8_ = auVar10._8_8_;
      uVar27 = local_ee0._8_8_;
      local_ee0._16_8_ = auVar10._16_8_;
      uVar28 = local_ee0._16_8_;
      local_ee0._24_8_ = auVar10._24_8_;
      uVar29 = local_ee0._24_8_;
      local_fe0._0_8_ = auVar9._0_8_;
      uVar30 = local_fe0._0_8_;
      local_fe0._8_8_ = auVar9._8_8_;
      uVar31 = local_fe0._8_8_;
      local_fe0._16_8_ = auVar9._16_8_;
      uVar32 = local_fe0._16_8_;
      local_fe0._24_8_ = auVar9._24_8_;
      uVar33 = local_fe0._24_8_;
      auVar8 = vpaddw_avx2(auVar10,auVar9);
      local_1000._0_8_ = auVar8._0_8_;
      uVar34 = local_1000._0_8_;
      local_1000._8_8_ = auVar8._8_8_;
      uVar35 = local_1000._8_8_;
      local_1000._16_8_ = auVar8._16_8_;
      uVar36 = local_1000._16_8_;
      local_1000._24_8_ = auVar8._24_8_;
      uVar37 = local_1000._24_8_;
      local_764 = 5;
      auVar8 = vpsrlw_avx2(auVar8,ZEXT416(5));
      local_1000._0_8_ = auVar8._0_8_;
      uVar13 = local_1000._0_8_;
      local_1000._8_8_ = auVar8._8_8_;
      uVar14 = local_1000._8_8_;
      local_1000._16_8_ = auVar8._16_8_;
      uVar38 = local_1000._16_8_;
      local_1000._24_8_ = auVar8._24_8_;
      uVar39 = local_1000._24_8_;
      auVar3._8_8_ = uStack_f68;
      auVar3._0_8_ = local_f70;
      auVar3 = vpcmpgtw_avx(auVar7,auVar3);
      local_f80._0_8_ = auVar3._0_8_;
      uVar15 = local_f80._0_8_;
      local_f80._8_8_ = auVar3._8_8_;
      uVar16 = local_f80._8_8_;
      auVar2 = vpblendvb_avx(auVar6,auVar8._0_16_,auVar3);
      *(undefined1 (*) [16])(local_10e0 + (long)local_fa8 * 2) = auVar2;
      local_fa4 = in_R8D + local_fa4;
      local_1030 = local_1000._0_8_;
      uStack_1028 = local_1000._8_8_;
      local_1000 = auVar8;
      local_fe0 = auVar9;
      local_f80 = auVar3;
      local_f20 = auVar11;
      local_ee0 = auVar10;
      local_ec0 = local_fa0._0_8_;
      uStack_eb8 = local_fa0._8_8_;
      auStack_eb0 = auVar71;
      local_ea0 = local_f90._0_8_;
      uStack_e98 = local_f90._8_8_;
      auStack_e90 = auVar71;
      local_e40 = uVar30;
      uStack_e38 = uVar31;
      uStack_e30 = uVar32;
      uStack_e28 = uVar33;
      local_e20 = uVar26;
      uStack_e18 = uVar27;
      uStack_e10 = uVar28;
      uStack_e08 = uVar29;
      local_e00 = local_d20._0_8_;
      uStack_df8 = local_d20._8_8_;
      uStack_df0 = auStack_d10._0_8_;
      uStack_de8 = auStack_d10._8_8_;
      local_de0 = uVar18;
      uStack_dd8 = uVar19;
      uStack_dd0 = uVar20;
      uStack_dc8 = uVar21;
      local_da0 = uVar13;
      uStack_d98 = uVar14;
      uStack_d90 = uVar38;
      uStack_d88 = uVar39;
      local_d70 = local_fa0._0_8_;
      uStack_d68 = local_fa0._8_8_;
      local_d60 = local_f90._0_8_;
      uStack_d58 = local_f90._8_8_;
      local_ba0 = local_f90._0_8_;
      uStack_b98 = local_f90._8_8_;
      uStack_b90 = uVar17;
      uStack_b88 = 0;
      local_b80 = local_fa0._0_8_;
      uStack_b78 = local_fa0._8_8_;
      uStack_b70 = uVar17;
      uStack_b68 = 0;
      local_820 = pauVar63;
      local_818 = pauVar62;
      local_760 = uVar34;
      uStack_758 = uVar35;
      uStack_750 = uVar36;
      uStack_748 = uVar37;
      local_6a0 = local_f90._0_8_;
      uStack_698 = local_f90._8_8_;
      uStack_690 = uVar17;
      uStack_688 = 0;
      local_680 = local_1020._0_8_;
      uStack_678 = local_1020._8_8_;
      uStack_670 = local_1020._16_8_;
      uStack_668 = local_1020._24_8_;
      local_660 = uVar22;
      uStack_658 = uVar23;
      uStack_650 = uVar24;
      uStack_648 = uVar25;
      local_640 = local_f70;
      uStack_638 = uStack_f68;
      local_630 = local_bc0._0_8_;
      uStack_628 = local_bc0._8_8_;
      local_5f0 = uVar15;
      uStack_5e8 = uVar16;
      local_5e0 = uVar13;
      uStack_5d8 = uVar14;
      local_5d0 = local_be0._0_8_;
      lStack_5c8 = local_be0._8_8_;
    }
  }
  else {
    local_924 = 8;
    iVar59 = 6 - in_ECX;
    local_b0 = 0xb << (local_e5c & 0x1f);
    local_5a8 = 0x10;
    local_504 = 0x10;
    local_508 = 0x10;
    local_50c = 0x10;
    local_510 = 0x10;
    local_514 = 0x10;
    local_518 = 0x10;
    local_51c = 0x10;
    local_520 = 0x10;
    auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar2 = vpinsrd_avx(auVar2,0x10,2);
    auVar2 = vpinsrd_avx(auVar2,0x10,3);
    auVar3 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
    auVar3 = vpinsrd_avx(auVar3,0x10,2);
    auVar3 = vpinsrd_avx(auVar3,0x10,3);
    local_540._0_8_ = auVar2._0_8_;
    local_540._8_8_ = auVar2._8_8_;
    auStack_530._0_8_ = auVar3._0_8_;
    auStack_530._8_8_ = auVar3._8_8_;
    local_9e0 = local_540._0_8_;
    uStack_9d8 = local_540._8_8_;
    uStack_9d0 = auStack_530._0_8_;
    uStack_9c8 = auStack_530._8_8_;
    uVar1 = *(ushort *)(in_RDX + (long)(int)local_b0 * 2);
    uStack_8e8 = CONCAT26(uVar1,(undefined6)uStack_8e8);
    auVar4 = vpinsrw_avx(ZEXT216(uVar1),(uint)uVar1,1);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,2);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,3);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,4);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,5);
    auVar4 = vpinsrw_avx(auVar4,(uint)uVar1,6);
    auVar71 = vpinsrw_avx(auVar4,(uint)uVar1,7);
    local_8e0._0_8_ = auVar71._0_8_;
    local_8e0._8_8_ = auVar71._8_8_;
    local_a10 = local_8e0._0_8_;
    lStack_a08 = local_8e0._8_8_;
    auVar4 = vpinsrd_avx(ZEXT416(local_b0),local_b0,1);
    auVar4 = vpinsrd_avx(auVar4,local_b0,2);
    local_c0 = vpinsrd_avx(auVar4,local_b0,3);
    local_a20 = local_c0._0_8_;
    uStack_a18 = local_c0._8_8_;
    local_a44 = in_R8D;
    for (local_a48 = 0; auVar4 = local_d20, auVar5 = auStack_d10, auVar10 = local_ce0,
        auVar6 = local_be0, auVar7 = local_bc0, local_948 = local_b0, local_944 = iVar59,
        local_930 = local_10e0, local_8d0 = uVar1, local_8ce = uVar1, local_8cc = uVar1,
        local_8ca = uVar1, local_8c8 = uVar1, local_8c6 = uVar1, local_8c4 = uVar1,
        local_8c2 = uVar1, local_5a4 = local_b0, local_ac = local_b0, local_a8 = local_b0,
        local_a4 = local_b0, local_a48 < 8; local_a48 = local_a48 + 1) {
      uVar60 = (int)local_a44 >> ((byte)iVar59 & 0x1f);
      local_ad4 = uVar60;
      if ((int)local_b0 <= (int)uVar60) {
        for (local_ad8 = local_a48; local_ad8 < 8; local_ad8 = local_ad8 + 1) {
          local_10e0[(long)local_ad8 * 2] = local_8e0._0_8_;
          local_10e0[(long)local_ad8 * 2 + 1] = local_8e0._8_8_;
        }
        break;
      }
      pauVar62 = (undefined1 (*) [16])(in_RDX + (long)(int)uVar60 * 2);
      uVar13 = *(undefined8 *)*pauVar62;
      uVar14 = *(undefined8 *)(*pauVar62 + 8);
      auVar10 = vpmovzxwd_avx2(*pauVar62);
      lVar64 = in_RDX + (long)(int)uVar60 * 2;
      pauVar63 = (undefined1 (*) [16])(lVar64 + 2);
      uVar15 = *(undefined8 *)*pauVar63;
      uVar16 = *(undefined8 *)(lVar64 + 10);
      _local_9a0 = vpmovzxwd_avx2(*pauVar63);
      if (in_ECX == 0) {
        local_38c = uVar60 + 1;
        local_390 = uVar60 + 2;
        local_394 = uVar60 + 3;
        auVar70._0_16_ = vpinsrd_avx(ZEXT416(uVar60),local_38c,1);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,local_390,2);
        local_100 = vpinsrd_avx(auVar70._0_16_,local_394,3);
        local_a30 = local_100._0_8_;
        uStack_a28 = local_100._8_8_;
        local_5ac = local_a44;
        local_4c4 = local_a44;
        local_4c8 = local_a44;
        local_4cc = local_a44;
        local_4d0 = local_a44;
        local_4d4 = local_a44;
        local_4d8 = local_a44;
        local_4dc = local_a44;
        local_4e0 = local_a44;
        auVar70._0_16_ = vpinsrd_avx(ZEXT416(local_a44),local_a44,1);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,local_a44,2);
        local_500 = vpinsrd_avx(auVar70._0_16_,local_a44,3);
        auVar70._0_16_ = vpinsrd_avx(ZEXT416(local_a44),local_a44,1);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,local_a44,2);
        auStack_4f0 = vpinsrd_avx(auVar70._0_16_,local_a44,3);
        local_5b0 = 0x3f;
        local_484 = 0x3f;
        local_488 = 0x3f;
        local_48c = 0x3f;
        local_490 = 0x3f;
        local_494 = 0x3f;
        local_498 = 0x3f;
        local_49c = 0x3f;
        local_4a0 = 0x3f;
        auVar70._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,0x3f,2);
        auVar70._16_16_ = vpinsrd_avx(auVar70._0_16_,0x3f,3);
        auVar70._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,0x3f,2);
        auVar70._0_16_ = vpinsrd_avx(auVar70._0_16_,0x3f,3);
        auVar70._0_16_ = ZEXT116(0) * auVar70._16_16_ + ZEXT116(1) * auVar70._0_16_;
        auVar70._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar70._16_16_;
        local_4c0._16_8_ = auVar70._16_8_;
        local_4c0._24_8_ = auVar70._24_8_;
        local_8a0 = local_500._0_8_;
        uStack_898 = local_500._8_8_;
        uStack_890 = auStack_4f0._0_8_;
        uStack_888 = auStack_4f0._8_8_;
        auVar9._16_8_ = auStack_4f0._0_8_;
        auVar9._0_16_ = local_500;
        auVar9._24_8_ = auStack_4f0._8_8_;
        auVar8._16_8_ = local_4c0._16_8_;
        auVar8._0_16_ = auVar70._0_16_;
        auVar8._24_8_ = local_4c0._24_8_;
        local_300 = vpand_avx2(auVar9,auVar8);
        local_304 = 1;
        local_ac0 = vpsrld_avx2(local_300,ZEXT416(1));
        local_980 = auVar10;
        local_4c0 = auVar70;
        local_388 = uVar60;
        local_f0 = uVar60;
        local_ec = local_38c;
        local_e8 = local_390;
        local_e4 = local_394;
      }
      else {
        local_980._0_8_ = auVar10._0_8_;
        local_980._8_8_ = auVar10._8_8_;
        local_980._16_8_ = auVar10._16_8_;
        local_980._24_8_ = auVar10._24_8_;
        local_3a8 = 7;
        local_3ac = 5;
        local_3b0 = 3;
        local_3b4 = 1;
        local_3b8 = 6;
        local_3bc = 4;
        local_3c0 = 2;
        local_3c4 = 0;
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(0),2,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,4,2);
        local_400 = vpinsrd_avx(auVar69._0_16_,6,3);
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(1),3,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,5,2);
        auStack_3f0 = vpinsrd_avx(auVar69._0_16_,7,3);
        local_560 = local_980._0_8_;
        uStack_558 = local_980._8_8_;
        uStack_550 = local_980._16_8_;
        uStack_548 = local_980._24_8_;
        local_580 = local_400._0_8_;
        uStack_578 = local_400._8_8_;
        uStack_570 = auStack_3f0._0_8_;
        uStack_568 = auStack_3f0._8_8_;
        auVar11._16_8_ = auStack_3f0._0_8_;
        auVar11._0_16_ = local_400;
        auVar11._24_8_ = auStack_3f0._8_8_;
        local_980 = vpermd_avx2(auVar11,auVar10);
        uStack_8e8 = local_980._24_8_;
        uStack_8f0 = local_980._16_8_;
        local_9a0._8_8_ = uStack_8f8;
        local_9a0._0_8_ = local_900;
        stack0xfffffffffffff670 = auVar10._0_16_;
        local_39c = uVar60 + 2;
        local_3a0 = uVar60 + 4;
        local_3a4 = uVar60 + 6;
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(uVar60),local_39c,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,local_3a0,2);
        local_e0 = vpinsrd_avx(auVar69._0_16_,local_3a4,3);
        local_a30 = local_e0._0_8_;
        uStack_a28 = local_e0._8_8_;
        local_5b4 = local_a44;
        local_444 = local_a44;
        local_448 = local_a44;
        local_44c = local_a44;
        local_450 = local_a44;
        local_454 = local_a44;
        local_458 = local_a44;
        local_45c = local_a44;
        local_460 = local_a44;
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(local_a44),local_a44,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,local_a44,2);
        local_480 = vpinsrd_avx(auVar69._0_16_,local_a44,3);
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(local_a44),local_a44,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,local_a44,2);
        auStack_470 = vpinsrd_avx(auVar69._0_16_,local_a44,3);
        local_2c0 = local_480._0_8_;
        uStack_2b8 = local_480._8_8_;
        uStack_2b0 = auStack_470._0_8_;
        uStack_2a8 = auStack_470._8_8_;
        auVar55._16_8_ = auStack_470._0_8_;
        auVar55._0_16_ = local_480;
        auVar55._24_8_ = auStack_470._8_8_;
        local_860 = vpslld_avx2(auVar55,ZEXT416(in_ECX));
        local_5b8 = 0x3f;
        local_404 = 0x3f;
        local_408 = 0x3f;
        local_40c = 0x3f;
        local_410 = 0x3f;
        local_414 = 0x3f;
        local_418 = 0x3f;
        local_41c = 0x3f;
        local_420 = 0x3f;
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,0x3f,2);
        auVar69._16_16_ = vpinsrd_avx(auVar69._0_16_,0x3f,3);
        auVar69._0_16_ = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,0x3f,2);
        auVar69._0_16_ = vpinsrd_avx(auVar69._0_16_,0x3f,3);
        auVar69._0_16_ = ZEXT116(0) * auVar69._16_16_ + ZEXT116(1) * auVar69._0_16_;
        auVar69._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar69._16_16_;
        local_440._16_8_ = auVar69._16_8_;
        local_440._24_8_ = auVar69._24_8_;
        auVar10._16_8_ = local_440._16_8_;
        auVar10._0_16_ = auVar69._0_16_;
        auVar10._24_8_ = local_440._24_8_;
        local_380 = vpand_avx2(local_860,auVar10);
        local_384 = 1;
        local_ac0 = vpsrld_avx2(local_380,ZEXT416(1));
        local_440 = auVar69;
        local_398 = uVar60;
        local_d0 = uVar60;
        local_cc = local_39c;
        local_c8 = local_3a0;
        local_c4 = local_3a4;
      }
      auVar11 = vpsubd_avx2(_local_9a0,local_980);
      local_284 = 5;
      auVar10 = vpslld_avx2(local_980,ZEXT416(5));
      local_9c0._0_8_ = auVar10._0_8_;
      uVar25 = local_9c0._0_8_;
      local_9c0._8_8_ = auVar10._8_8_;
      uVar26 = local_9c0._8_8_;
      local_9c0._16_8_ = auVar10._16_8_;
      uVar27 = local_9c0._16_8_;
      local_9c0._24_8_ = auVar10._24_8_;
      uVar28 = local_9c0._24_8_;
      auVar56._16_8_ = auStack_530._0_8_;
      auVar56._0_16_ = auVar2;
      auVar56._24_8_ = auStack_530._8_8_;
      auVar10 = vpaddd_avx2(auVar10,auVar56);
      local_a00._0_8_ = auVar11._0_8_;
      uVar29 = local_a00._0_8_;
      local_a00._8_8_ = auVar11._8_8_;
      uVar30 = local_a00._8_8_;
      local_a00._16_8_ = auVar11._16_8_;
      uVar31 = local_a00._16_8_;
      local_a00._24_8_ = auVar11._24_8_;
      uVar32 = local_a00._24_8_;
      auVar9 = vpmulld_avx2(auVar11,local_ac0);
      local_9c0._0_8_ = auVar10._0_8_;
      uVar33 = local_9c0._0_8_;
      local_9c0._8_8_ = auVar10._8_8_;
      uVar34 = local_9c0._8_8_;
      local_9c0._16_8_ = auVar10._16_8_;
      uVar35 = local_9c0._16_8_;
      local_9c0._24_8_ = auVar10._24_8_;
      uVar36 = local_9c0._24_8_;
      local_a80._0_8_ = auVar9._0_8_;
      uVar37 = local_a80._0_8_;
      local_a80._8_8_ = auVar9._8_8_;
      uVar38 = local_a80._8_8_;
      local_a80._16_8_ = auVar9._16_8_;
      uVar39 = local_a80._16_8_;
      local_a80._24_8_ = auVar9._24_8_;
      uVar40 = local_a80._24_8_;
      auVar8 = vpaddd_avx2(auVar10,auVar9);
      local_aa0._0_8_ = auVar8._0_8_;
      uVar41 = local_aa0._0_8_;
      local_aa0._8_8_ = auVar8._8_8_;
      uVar42 = local_aa0._8_8_;
      local_aa0._16_8_ = auVar8._16_8_;
      uVar43 = local_aa0._16_8_;
      local_aa0._24_8_ = auVar8._24_8_;
      uVar44 = local_aa0._24_8_;
      local_344 = 5;
      auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
      local_aa0._0_8_ = auVar8._0_8_;
      uVar17 = local_aa0._0_8_;
      local_aa0._8_8_ = auVar8._8_8_;
      uVar18 = local_aa0._8_8_;
      local_aa0._16_8_ = auVar8._16_8_;
      uVar45 = local_aa0._16_8_;
      local_aa0._24_8_ = auVar8._24_8_;
      uVar46 = local_aa0._24_8_;
      auVar5 = vpackusdw_avx(auVar8._0_16_,auVar8._0_16_);
      auVar4._8_8_ = uStack_a28;
      auVar4._0_8_ = local_a30;
      auVar4 = vpcmpgtd_avx(local_c0,auVar4);
      local_a40._0_8_ = auVar4._0_8_;
      uVar19 = local_a40._0_8_;
      local_a40._8_8_ = auVar4._8_8_;
      uVar20 = local_a40._8_8_;
      auVar4 = vpackssdw_avx(auVar4,auVar4);
      local_ad0._0_8_ = auVar5._0_8_;
      uVar21 = local_ad0._0_8_;
      local_ad0._8_8_ = auVar5._8_8_;
      uVar22 = local_ad0._8_8_;
      local_a40._0_8_ = auVar4._0_8_;
      uVar23 = local_a40._0_8_;
      local_a40._8_8_ = auVar4._8_8_;
      uVar24 = local_a40._8_8_;
      auVar6 = vpblendvb_avx(auVar71,auVar5,auVar4);
      *(undefined1 (*) [16])(local_10e0 + (long)local_a48 * 2) = auVar6;
      local_a44 = in_R8D + local_a44;
      local_ad0 = auVar5;
      local_aa0 = auVar8;
      local_a80 = auVar9;
      local_a40 = auVar4;
      local_a00 = auVar11;
      local_9c0 = auVar10;
      local_920 = uVar17;
      uStack_918 = uVar18;
      uStack_910 = uVar45;
      uStack_908 = uVar46;
      local_830 = pauVar63;
      local_828 = pauVar62;
      local_620 = uVar23;
      uStack_618 = uVar24;
      local_610 = uVar21;
      uStack_608 = uVar22;
      local_600 = local_8e0._0_8_;
      lStack_5f8 = local_8e0._8_8_;
      local_5a0 = uVar15;
      uStack_598 = uVar16;
      local_590 = uVar13;
      uStack_588 = uVar14;
      local_340 = uVar41;
      uStack_338 = uVar42;
      uStack_330 = uVar43;
      uStack_328 = uVar44;
      local_280 = local_980._0_8_;
      uStack_278 = local_980._8_8_;
      uStack_270 = local_980._16_8_;
      uStack_268 = local_980._24_8_;
      local_260 = local_980._0_8_;
      uStack_258 = local_980._8_8_;
      uStack_250 = local_980._16_8_;
      uStack_248 = local_980._24_8_;
      local_240 = local_9a0._0_8_;
      uStack_238 = local_9a0._8_8_;
      uStack_230 = local_9a0._16_8_;
      uStack_228 = uStack_988;
      local_220 = uVar37;
      uStack_218 = uVar38;
      uStack_210 = uVar39;
      uStack_208 = uVar40;
      local_200 = uVar33;
      uStack_1f8 = uVar34;
      uStack_1f0 = uVar35;
      uStack_1e8 = uVar36;
      local_1e0 = local_540._0_8_;
      uStack_1d8 = local_540._8_8_;
      uStack_1d0 = auStack_530._0_8_;
      uStack_1c8 = auStack_530._8_8_;
      local_1c0 = uVar25;
      uStack_1b8 = uVar26;
      uStack_1b0 = uVar27;
      uStack_1a8 = uVar28;
      local_1a0 = local_ac0._0_8_;
      uStack_198 = local_ac0._8_8_;
      uStack_190 = local_ac0._16_8_;
      uStack_188 = local_ac0._24_8_;
      local_180 = uVar29;
      uStack_178 = uVar30;
      uStack_170 = uVar31;
      uStack_168 = uVar32;
      local_160 = uVar17;
      uStack_158 = uVar18;
      local_150 = uVar17;
      uStack_148 = uVar18;
      local_140 = local_a30;
      uStack_138 = uStack_a28;
      local_130 = local_c0._0_8_;
      uStack_128 = local_c0._8_8_;
      local_120 = uVar19;
      uStack_118 = uVar20;
      local_110 = uVar19;
      uStack_108 = uVar20;
    }
  }
  auStack_530 = auVar3;
  local_540 = auVar2;
  local_8e0 = auVar71;
  local_bc0 = auVar7;
  local_be0 = auVar6;
  local_ce0 = auVar10;
  auStack_d10 = auVar5;
  local_d20 = auVar4;
  local_1048 = in_RSI;
  local_1040 = in_RDI;
  local_f40 = auVar66._0_16_;
  auStack_f30 = auVar66._16_16_;
  local_b40 = auVar68._0_16_;
  auStack_b30 = auVar68._16_16_;
  local_b20 = auVar67._0_16_;
  auStack_b10 = auVar67._16_16_;
  local_8c0 = auVar70._0_16_;
  auStack_8b0 = auVar70._16_16_;
  local_880 = auVar69._0_16_;
  auStack_870 = auVar69._16_16_;
  local_b60 = auVar57;
  auStack_b50 = auVar58;
  highbd_transpose8x8_low_sse2
            ((__m128i *)local_10e0,(__m128i *)(local_10e0 + 2),(__m128i *)(local_10e0 + 4),
             &alStack_10b0,&alStack_10a0,&alStack_1090,&alStack_1080,(__m128i *)alStack_1070,
             (__m128i *)&local_1120,(__m128i *)&local_1110,(__m128i *)&local_1100,
             (__m128i *)&local_10f0);
  *local_1040 = local_1120;
  local_1040[1] = lStack_1118;
  plVar65 = (longlong *)((long)local_1040 + local_1048 * 2);
  *plVar65 = local_1110;
  plVar65[1] = lStack_1108;
  plVar65 = (longlong *)((long)local_1040 + local_1048 * 4);
  *plVar65 = local_1100;
  plVar65[1] = lStack_10f8;
  local_1040 = (longlong *)((long)local_1040 + local_1048 * 6);
  *local_1040 = local_10f0;
  local_1040[1] = lStack_10e8;
  return;
}

Assistant:

static void highbd_dr_prediction_z3_8x4_avx2(uint16_t *dst, ptrdiff_t stride,
                                             const uint16_t *left,
                                             int upsample_left, int dy,
                                             int bd) {
  __m128i dstvec[8], d[4];
  if (bd < 12) {
    highbd_dr_prediction_z1_4xN_internal_avx2(8, dstvec, left, upsample_left,
                                              dy);
  } else {
    highbd_dr_prediction_32bit_z1_4xN_internal_avx2(8, dstvec, left,
                                                    upsample_left, dy);
  }

  highbd_transpose8x8_low_sse2(&dstvec[0], &dstvec[1], &dstvec[2], &dstvec[3],
                               &dstvec[4], &dstvec[5], &dstvec[6], &dstvec[7],
                               &d[0], &d[1], &d[2], &d[3]);
  _mm_storeu_si128((__m128i *)(dst + 0 * stride), d[0]);
  _mm_storeu_si128((__m128i *)(dst + 1 * stride), d[1]);
  _mm_storeu_si128((__m128i *)(dst + 2 * stride), d[2]);
  _mm_storeu_si128((__m128i *)(dst + 3 * stride), d[3]);
}